

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::EscapeForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,bool makeVars,
          bool forEcho,bool useWatcomQuote,bool unescapeNinjaConfiguration,bool forResponse)

{
  bool bVar1;
  cmState *pcVar2;
  int flags_00;
  cmOutputConverter *pcVar3;
  string_view str_00;
  uint local_34;
  int flags;
  bool forResponse_local;
  bool unescapeNinjaConfiguration_local;
  bool useWatcomQuote_local;
  bool forEcho_local;
  bool makeVars_local;
  cmOutputConverter *this_local;
  string_view str_local;
  
  pcVar3 = this;
  pcVar2 = GetState(this);
  flags_00 = (int)pcVar3;
  bVar1 = cmState::UseWindowsVSIDE(pcVar2);
  if (bVar1) {
    local_34 = 2;
  }
  else {
    local_34 = (uint)((this->LinkScriptShell & 1U) == 0);
  }
  if (unescapeNinjaConfiguration) {
    local_34 = local_34 | 0x200;
  }
  if (makeVars) {
    local_34 = local_34 | 0x40;
  }
  if (forEcho) {
    local_34 = local_34 | 4;
  }
  if (useWatcomQuote) {
    local_34 = local_34 | 0x80;
  }
  if (forResponse) {
    local_34 = local_34 | 0x400;
  }
  pcVar2 = GetState(this);
  bVar1 = cmState::UseWatcomWMake(pcVar2);
  if (bVar1) {
    local_34 = local_34 | 8;
  }
  pcVar2 = GetState(this);
  bVar1 = cmState::UseMinGWMake(pcVar2);
  if (bVar1) {
    local_34 = local_34 | 0x10;
  }
  pcVar2 = GetState(this);
  bVar1 = cmState::UseNMake(pcVar2);
  if (bVar1) {
    local_34 = local_34 | 0x20;
  }
  pcVar2 = GetState(this);
  bVar1 = cmState::UseNinja(pcVar2);
  if (bVar1) {
    local_34 = local_34 | 0x800;
  }
  pcVar2 = GetState(this);
  bVar1 = cmState::UseWindowsShell(pcVar2);
  if (!bVar1) {
    local_34 = local_34 | 0x100;
  }
  str_00._M_str._0_4_ = local_34;
  str_00._M_len = (size_t)str._M_str;
  str_00._M_str._4_4_ = 0;
  EscapeForShell_abi_cxx11_(__return_storage_ptr__,(cmOutputConverter *)str._M_len,str_00,flags_00);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForShell(cm::string_view str,
                                              bool makeVars, bool forEcho,
                                              bool useWatcomQuote,
                                              bool unescapeNinjaConfiguration,
                                              bool forResponse) const
{
  // Compute the flags for the target shell environment.
  int flags = 0;
  if (this->GetState()->UseWindowsVSIDE()) {
    flags |= Shell_Flag_VSIDE;
  } else if (!this->LinkScriptShell) {
    flags |= Shell_Flag_Make;
  }
  if (unescapeNinjaConfiguration) {
    flags |= Shell_Flag_UnescapeNinjaConfiguration;
  }
  if (makeVars) {
    flags |= Shell_Flag_AllowMakeVariables;
  }
  if (forEcho) {
    flags |= Shell_Flag_EchoWindows;
  }
  if (useWatcomQuote) {
    flags |= Shell_Flag_WatcomQuote;
  }
  if (forResponse) {
    flags |= Shell_Flag_IsResponse;
  }
  if (this->GetState()->UseWatcomWMake()) {
    flags |= Shell_Flag_WatcomWMake;
  }
  if (this->GetState()->UseMinGWMake()) {
    flags |= Shell_Flag_MinGWMake;
  }
  if (this->GetState()->UseNMake()) {
    flags |= Shell_Flag_NMake;
  }
  if (this->GetState()->UseNinja()) {
    flags |= Shell_Flag_Ninja;
  }
  if (!this->GetState()->UseWindowsShell()) {
    flags |= Shell_Flag_IsUnix;
  }

  return cmOutputConverter::EscapeForShell(str, flags);
}